

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1.c
# Opt level: O0

void t1_dec_clnpass(opj_t1_t *t1,int bpno,int orient,int cblksty)

{
  long lVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  uint in_ECX;
  byte in_SIL;
  long in_RDI;
  int v;
  flag_t *flags2_1;
  int *data2_1;
  flag_t *flags2;
  int *data2;
  flag_t *flags1;
  int *data1;
  opj_mqc_t *mqc;
  int segsym;
  int vsc;
  int runlen;
  int agg;
  int oneplushalf;
  int half;
  int one;
  int k;
  int j;
  int i;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  undefined8 in_stack_ffffffffffffff58;
  int *in_stack_ffffffffffffff60;
  flag_t *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  undefined1 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff79;
  undefined1 in_stack_ffffffffffffff7a;
  bool bVar6;
  undefined1 in_stack_ffffffffffffff7b;
  bool bVar7;
  uint in_stack_ffffffffffffff7c;
  undefined3 uVar8;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  flag_t *in_stack_ffffffffffffff88;
  opj_t1_t *in_stack_ffffffffffffff90;
  undefined8 in_stack_ffffffffffffffa0;
  uint local_34;
  int local_20;
  int local_1c;
  int local_18;
  
  lVar1 = *(long *)(in_RDI + 8);
  uVar3 = 1 << (in_SIL & 0x1f);
  if ((in_ECX & 8) == 0) {
    for (local_20 = 0; local_20 < (int)(*(uint *)(in_RDI + 0x2c) & 0xfffffffc);
        local_20 = local_20 + 4) {
      for (local_18 = 0; local_18 < *(int *)(in_RDI + 0x28); local_18 = local_18 + 1) {
        bVar7 = true;
        if ((((*(ushort *)
                (*(long *)(in_RDI + 0x20) +
                (long)((local_20 + 1) * *(int *)(in_RDI + 0x38) + local_18 + 1) * 2) & 0x50ff) == 0)
            && (bVar7 = true,
               (*(ushort *)
                 (*(long *)(in_RDI + 0x20) +
                 (long)((local_20 + 2) * *(int *)(in_RDI + 0x38) + local_18 + 1) * 2) & 0x50ff) == 0
               )) && (bVar7 = true,
                     (*(ushort *)
                       (*(long *)(in_RDI + 0x20) +
                       (long)((local_20 + 3) * *(int *)(in_RDI + 0x38) + local_18 + 1) * 2) & 0x50ff
                     ) == 0)) {
          bVar7 = (*(ushort *)
                    (*(long *)(in_RDI + 0x20) +
                    (long)((local_20 + 4) * *(int *)(in_RDI + 0x38) + local_18 + 1) * 2) & 0x50ff)
                  != 0;
        }
        if ((bool)(bVar7 ^ 1U)) {
          *(long *)(lVar1 + 0xc0) = lVar1 + 0xb0;
          iVar4 = mqc_decode((opj_mqc_t *)
                             CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
          if (iVar4 != 0) {
            *(long *)(lVar1 + 0xc0) = lVar1 + 0xb8;
            iVar4 = mqc_decode((opj_mqc_t *)
                               CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
            uVar3 = mqc_decode((opj_mqc_t *)
                               CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
            uVar3 = iVar4 << 1 | uVar3;
            local_1c = local_20 + uVar3;
            while( true ) {
              bVar6 = false;
              if (local_1c < local_20 + 4) {
                bVar6 = local_1c < *(int *)(in_RDI + 0x2c);
              }
              if (!bVar6) break;
              if (((bool)(bVar7 ^ 1U)) && (local_1c == local_20 + uVar3)) {
                t1_dec_clnpass_step_partial
                          ((opj_t1_t *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70)
                           ,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
                           (int)((ulong)in_stack_ffffffffffffff58 >> 0x20),
                           (int)in_stack_ffffffffffffff58);
              }
              else {
                t1_dec_clnpass_step((opj_t1_t *)
                                    CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                                    (flag_t *)
                                    CONCAT44(in_stack_ffffffffffffff7c,
                                             CONCAT13(in_stack_ffffffffffffff7b,
                                                      CONCAT12(in_stack_ffffffffffffff7a,
                                                               CONCAT11(in_stack_ffffffffffffff79,
                                                                        in_stack_ffffffffffffff78)))
                                            ),
                                    (int *)CONCAT44(in_stack_ffffffffffffff74,
                                                    in_stack_ffffffffffffff70),
                                    (int)((ulong)in_stack_ffffffffffffff68 >> 0x20),
                                    (int)in_stack_ffffffffffffff68);
              }
              local_1c = local_1c + 1;
            }
          }
        }
        else {
          t1_dec_clnpass_step((opj_t1_t *)
                              CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                              (flag_t *)
                              CONCAT44(in_stack_ffffffffffffff7c,
                                       CONCAT13(in_stack_ffffffffffffff7b,
                                                CONCAT12(in_stack_ffffffffffffff7a,
                                                         CONCAT11(in_stack_ffffffffffffff79,
                                                                  in_stack_ffffffffffffff78)))),
                              (int *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                              (int)((ulong)in_stack_ffffffffffffff68 >> 0x20),
                              (int)in_stack_ffffffffffffff68);
          t1_dec_clnpass_step((opj_t1_t *)
                              CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                              (flag_t *)
                              CONCAT44(in_stack_ffffffffffffff7c,
                                       CONCAT13(in_stack_ffffffffffffff7b,
                                                CONCAT12(in_stack_ffffffffffffff7a,
                                                         CONCAT11(in_stack_ffffffffffffff79,
                                                                  in_stack_ffffffffffffff78)))),
                              (int *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                              (int)((ulong)in_stack_ffffffffffffff68 >> 0x20),
                              (int)in_stack_ffffffffffffff68);
          t1_dec_clnpass_step((opj_t1_t *)
                              CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                              (flag_t *)
                              CONCAT44(in_stack_ffffffffffffff7c,
                                       CONCAT13(in_stack_ffffffffffffff7b,
                                                CONCAT12(in_stack_ffffffffffffff7a,
                                                         CONCAT11(in_stack_ffffffffffffff79,
                                                                  in_stack_ffffffffffffff78)))),
                              (int *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                              (int)((ulong)in_stack_ffffffffffffff68 >> 0x20),
                              (int)in_stack_ffffffffffffff68);
          t1_dec_clnpass_step((opj_t1_t *)
                              CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                              (flag_t *)
                              CONCAT44(in_stack_ffffffffffffff7c,
                                       CONCAT13(in_stack_ffffffffffffff7b,
                                                CONCAT12(in_stack_ffffffffffffff7a,
                                                         CONCAT11(in_stack_ffffffffffffff79,
                                                                  in_stack_ffffffffffffff78)))),
                              (int *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                              (int)((ulong)in_stack_ffffffffffffff68 >> 0x20),
                              (int)in_stack_ffffffffffffff68);
        }
      }
    }
    for (local_18 = 0; local_18 < *(int *)(in_RDI + 0x28); local_18 = local_18 + 1) {
      for (local_1c = local_20; local_1c < *(int *)(in_RDI + 0x2c); local_1c = local_1c + 1) {
        t1_dec_clnpass_step((opj_t1_t *)
                            CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                            (flag_t *)
                            CONCAT44(in_stack_ffffffffffffff7c,
                                     CONCAT13(in_stack_ffffffffffffff7b,
                                              CONCAT12(in_stack_ffffffffffffff7a,
                                                       CONCAT11(in_stack_ffffffffffffff79,
                                                                in_stack_ffffffffffffff78)))),
                            (int *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                            (int)((ulong)in_stack_ffffffffffffff68 >> 0x20),
                            (int)in_stack_ffffffffffffff68);
      }
    }
  }
  else {
    for (local_20 = 0; local_20 < *(int *)(in_RDI + 0x2c); local_20 = local_20 + 4) {
      for (local_18 = 0; local_18 < *(int *)(in_RDI + 0x28); local_18 = local_18 + 1) {
        if (local_20 + 3 < *(int *)(in_RDI + 0x2c)) {
          uVar8 = (undefined3)in_stack_ffffffffffffff80;
          in_stack_ffffffffffffff80 = CONCAT13(1,uVar8);
          if ((((*(ushort *)
                  (*(long *)(in_RDI + 0x20) +
                  (long)((local_20 + 1) * *(int *)(in_RDI + 0x38) + local_18 + 1) * 2) & 0x50ff) ==
                0) && (in_stack_ffffffffffffff80 = CONCAT13(1,uVar8),
                      (*(ushort *)
                        (*(long *)(in_RDI + 0x20) +
                        (long)((local_20 + 2) * *(int *)(in_RDI + 0x38) + local_18 + 1) * 2) &
                      0x50ff) == 0)) &&
             (in_stack_ffffffffffffff80 = CONCAT13(1,uVar8),
             (*(ushort *)
               (*(long *)(in_RDI + 0x20) +
               (long)((local_20 + 3) * *(int *)(in_RDI + 0x38) + local_18 + 1) * 2) & 0x50ff) == 0))
          {
            in_stack_ffffffffffffff80 =
                 CONCAT13((*(ushort *)
                            (*(long *)(in_RDI + 0x20) +
                            (long)((local_20 + 4) * *(int *)(in_RDI + 0x38) + local_18 + 1) * 2) &
                          0x50b9) != 0,uVar8);
          }
          bVar2 = ((byte)((uint)in_stack_ffffffffffffff80 >> 0x18) ^ 0xff) & 1;
        }
        else {
          bVar2 = 0;
        }
        if (bVar2 == 0) {
          local_34 = 0;
LAB_00164ee5:
          local_1c = local_20 + local_34;
          while( true ) {
            bVar7 = false;
            if (local_1c < local_20 + 4) {
              bVar7 = local_1c < *(int *)(in_RDI + 0x2c);
            }
            if (bVar7 == false) break;
            bVar6 = true;
            if (local_1c != local_20 + 3) {
              bVar6 = local_1c == *(int *)(in_RDI + 0x2c) + -1;
            }
            t1_dec_clnpass_step_vsc
                      (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                       (int *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                       in_stack_ffffffffffffff7c,
                       CONCAT13(bVar7,CONCAT12(bVar6,CONCAT11(bVar2 != 0 &&
                                                              local_1c == local_20 + local_34,
                                                              in_stack_ffffffffffffff78))),
                       uVar3 | (int)uVar3 >> 1,(int)in_stack_ffffffffffffffa0);
            local_1c = local_1c + 1;
          }
        }
        else {
          *(long *)(lVar1 + 0xc0) = lVar1 + 0xb0;
          iVar4 = mqc_decode((opj_mqc_t *)
                             CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
          if (iVar4 != 0) {
            *(long *)(lVar1 + 0xc0) = lVar1 + 0xb8;
            iVar4 = mqc_decode((opj_mqc_t *)
                               CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
            in_stack_ffffffffffffff7c = iVar4 << 1;
            local_34 = mqc_decode((opj_mqc_t *)
                                  CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
            local_34 = in_stack_ffffffffffffff7c | local_34;
            goto LAB_00164ee5;
          }
        }
      }
    }
  }
  if ((in_ECX & 0x20) != 0) {
    *(long *)(lVar1 + 0xc0) = lVar1 + 0xb8;
    iVar4 = mqc_decode((opj_mqc_t *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
    uVar3 = iVar4 << 1;
    uVar5 = mqc_decode((opj_mqc_t *)CONCAT44(in_stack_ffffffffffffff44,uVar3));
    iVar4 = (uVar3 | uVar5) << 1;
    mqc_decode((opj_mqc_t *)CONCAT44(iVar4,uVar3));
    mqc_decode((opj_mqc_t *)CONCAT44(iVar4,uVar3));
  }
  return;
}

Assistant:

static void t1_dec_clnpass(
		opj_t1_t *t1,
		int bpno,
		int orient,
		int cblksty)
{
	int i, j, k, one, half, oneplushalf, agg, runlen, vsc;
	int segsym = cblksty & J2K_CCP_CBLKSTY_SEGSYM;
	
	opj_mqc_t *mqc = t1->mqc;	/* MQC component */
	
	one = 1 << bpno;
	half = one >> 1;
	oneplushalf = one | half;
	if (cblksty & J2K_CCP_CBLKSTY_VSC) {
	for (k = 0; k < t1->h; k += 4) {
		for (i = 0; i < t1->w; ++i) {
			if (k + 3 < t1->h) {
					agg = !(MACRO_t1_flags(1 + k,1 + i) & (T1_SIG | T1_VISIT | T1_SIG_OTH)
						|| MACRO_t1_flags(1 + k + 1,1 + i) & (T1_SIG | T1_VISIT | T1_SIG_OTH)
						|| MACRO_t1_flags(1 + k + 2,1 + i) & (T1_SIG | T1_VISIT | T1_SIG_OTH)
						|| (MACRO_t1_flags(1 + k + 3,1 + i) 
						& (~(T1_SIG_S | T1_SIG_SE | T1_SIG_SW |	T1_SGN_S))) & (T1_SIG | T1_VISIT | T1_SIG_OTH));
				} else {
				agg = 0;
			}
			if (agg) {
				mqc_setcurctx(mqc, T1_CTXNO_AGG);
				if (!mqc_decode(mqc)) {
					continue;
				}
				mqc_setcurctx(mqc, T1_CTXNO_UNI);
				runlen = mqc_decode(mqc);
				runlen = (runlen << 1) | mqc_decode(mqc);
			} else {
				runlen = 0;
			}
			for (j = k + runlen; j < k + 4 && j < t1->h; ++j) {
					vsc = (j == k + 3 || j == t1->h - 1) ? 1 : 0;
					t1_dec_clnpass_step_vsc(
						t1,
						&t1->flags[((j+1) * t1->flags_stride) + i + 1],
						&t1->data[(j * t1->w) + i],
						orient,
						oneplushalf,
						agg && (j == k + runlen),
						vsc);
			}
		}
	}
	} else {
		int *data1 = t1->data;
		flag_t *flags1 = &t1->flags[1];
		for (k = 0; k < (t1->h & ~3); k += 4) {
			for (i = 0; i < t1->w; ++i) {
				int *data2 = data1 + i;
				flag_t *flags2 = flags1 + i;
				agg = !(MACRO_t1_flags(1 + k,1 + i) & (T1_SIG | T1_VISIT | T1_SIG_OTH)
					|| MACRO_t1_flags(1 + k + 1,1 + i) & (T1_SIG | T1_VISIT | T1_SIG_OTH)
					|| MACRO_t1_flags(1 + k + 2,1 + i) & (T1_SIG | T1_VISIT | T1_SIG_OTH)
					|| MACRO_t1_flags(1 + k + 3,1 + i) & (T1_SIG | T1_VISIT | T1_SIG_OTH));
				if (agg) {
					mqc_setcurctx(mqc, T1_CTXNO_AGG);
					if (!mqc_decode(mqc)) {
						continue;
					}
					mqc_setcurctx(mqc, T1_CTXNO_UNI);
					runlen = mqc_decode(mqc);
					runlen = (runlen << 1) | mqc_decode(mqc);
					flags2 += runlen * t1->flags_stride;
					data2 += runlen * t1->w;
					for (j = k + runlen; j < k + 4 && j < t1->h; ++j) {
						flags2 += t1->flags_stride;
						if (agg && (j == k + runlen)) {
							t1_dec_clnpass_step_partial(t1, flags2, data2, orient, oneplushalf);
						} else {
							t1_dec_clnpass_step(t1, flags2, data2, orient, oneplushalf);
						}
						data2 += t1->w;
					}
				} else {
					flags2 += t1->flags_stride;
					t1_dec_clnpass_step(t1, flags2, data2, orient, oneplushalf);
					data2 += t1->w;
					flags2 += t1->flags_stride;
					t1_dec_clnpass_step(t1, flags2, data2, orient, oneplushalf);
					data2 += t1->w;
					flags2 += t1->flags_stride;
					t1_dec_clnpass_step(t1, flags2, data2, orient, oneplushalf);
					data2 += t1->w;
					flags2 += t1->flags_stride;
					t1_dec_clnpass_step(t1, flags2, data2, orient, oneplushalf);
					data2 += t1->w;
				}
			}
			data1 += t1->w << 2;
			flags1 += t1->flags_stride << 2;
		}
		for (i = 0; i < t1->w; ++i) {
			int *data2 = data1 + i;
			flag_t *flags2 = flags1 + i;
			for (j = k; j < t1->h; ++j) {
				flags2 += t1->flags_stride;
				t1_dec_clnpass_step(t1, flags2, data2, orient, oneplushalf);
				data2 += t1->w;
			}
		}
	}

	if (segsym) {
		int v = 0;
		mqc_setcurctx(mqc, T1_CTXNO_UNI);
		v = mqc_decode(mqc);
		v = (v << 1) | mqc_decode(mqc);
		v = (v << 1) | mqc_decode(mqc);
		v = (v << 1) | mqc_decode(mqc);
		/*
		if (v!=0xa) {
			opj_event_msg(t1->cinfo, EVT_WARNING, "Bad segmentation symbol %x\n", v);
		} 
		*/
	}
}